

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t lazy_stat(archive_write_disk *a)

{
  int iVar1;
  uint *puVar2;
  archive *in_RDI;
  wchar_t local_4;
  
  if (in_RDI[3].error == (char *)0x0) {
    if ((-1 < (int)in_RDI[4].state) &&
       (iVar1 = fstat(in_RDI[4].state,(stat *)&in_RDI[2].archive_format_name), iVar1 == 0)) {
      in_RDI[3].error = (char *)&in_RDI[2].archive_format_name;
      return L'\0';
    }
    iVar1 = lstat((char *)in_RDI[3].error_string.length,(stat *)&in_RDI[2].archive_format_name);
    if (iVar1 == 0) {
      in_RDI[3].error = (char *)&in_RDI[2].archive_format_name;
      local_4 = L'\0';
    }
    else {
      puVar2 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar2,"Couldn\'t stat file");
      local_4 = L'\xffffffec';
    }
  }
  else {
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
lazy_stat(struct archive_write_disk *a)
{
	if (a->pst != NULL) {
		/* Already have stat() data available. */
		return (ARCHIVE_OK);
	}
#ifdef HAVE_FSTAT
	if (a->fd >= 0 && fstat(a->fd, &a->st) == 0) {
		a->pst = &a->st;
		return (ARCHIVE_OK);
	}
#endif
	/*
	 * XXX At this point, symlinks should not be hit, otherwise
	 * XXX a race occurred.  Do we want to check explicitly for that?
	 */
	if (lstat(a->name, &a->st) == 0) {
		a->pst = &a->st;
		return (ARCHIVE_OK);
	}
	archive_set_error(&a->archive, errno, "Couldn't stat file");
	return (ARCHIVE_WARN);
}